

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

void __thiscall cmCTestBZR::LogParser::StartElement(LogParser *this,string *name,char **param_2)

{
  bool bVar1;
  Change local_210;
  Change local_1e8;
  Change local_1c0;
  Change local_198;
  Change local_170;
  Change local_148;
  Revision local_120;
  char **local_20;
  char **param_2_local;
  string *name_local;
  LogParser *this_local;
  
  local_20 = param_2;
  param_2_local = (char **)name;
  name_local = (string *)this;
  std::vector<char,_std::allocator<char>_>::clear(&this->CData);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          param_2_local,"log");
  if (bVar1) {
    memset(&local_120,0,0x100);
    cmCTestVC::Revision::Revision(&local_120);
    cmCTestVC::Revision::operator=(&this->Rev,&local_120);
    cmCTestVC::Revision::~Revision(&local_120);
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::clear
              (&this->Changes);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            param_2_local,"modified");
    if (((bVar1) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)param_2_local,"renamed"), bVar1)) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )param_2_local,"kind-changed"), bVar1)) {
      cmCTestGlobalVC::Change::Change(&local_148,'?');
      cmCTestGlobalVC::Change::operator=(&this->CurChange,&local_148);
      cmCTestGlobalVC::Change::~Change(&local_148);
      (this->CurChange).Action = 'M';
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              param_2_local,"added");
      if (bVar1) {
        cmCTestGlobalVC::Change::Change(&local_170,'?');
        cmCTestGlobalVC::Change::operator=(&this->CurChange,&local_170);
        cmCTestGlobalVC::Change::~Change(&local_170);
        cmCTestGlobalVC::Change::Change(&local_198,'A');
        cmCTestGlobalVC::Change::operator=(&this->CurChange,&local_198);
        cmCTestGlobalVC::Change::~Change(&local_198);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )param_2_local,"removed");
        if (bVar1) {
          cmCTestGlobalVC::Change::Change(&local_1c0,'?');
          cmCTestGlobalVC::Change::operator=(&this->CurChange,&local_1c0);
          cmCTestGlobalVC::Change::~Change(&local_1c0);
          cmCTestGlobalVC::Change::Change(&local_1e8,'D');
          cmCTestGlobalVC::Change::operator=(&this->CurChange,&local_1e8);
          cmCTestGlobalVC::Change::~Change(&local_1e8);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)param_2_local,"unknown");
          if ((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)param_2_local,"conflicts"), bVar1)) {
            cmCTestGlobalVC::Change::Change(&local_210,'?');
            cmCTestGlobalVC::Change::operator=(&this->CurChange,&local_210);
            cmCTestGlobalVC::Change::~Change(&local_210);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void StartElement(const std::string& name, const char** /*atts*/) CM_OVERRIDE
  {
    this->CData.clear();
    if (name == "log") {
      this->Rev = Revision();
      this->Changes.clear();
    }
    // affected-files can contain blocks of
    // modified, unknown, renamed, kind-changed, removed, conflicts, added
    else if (name == "modified" || name == "renamed" ||
             name == "kind-changed") {
      this->CurChange = Change();
      this->CurChange.Action = 'M';
    } else if (name == "added") {
      this->CurChange = Change();
      this->CurChange = 'A';
    } else if (name == "removed") {
      this->CurChange = Change();
      this->CurChange = 'D';
    } else if (name == "unknown" || name == "conflicts") {
      // Should not happen here
      this->CurChange = Change();
    }
  }